

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::BuildEngineTest_discoveredDependencies_Test::TestBody()::
TaskWithDiscoveredDependency::start(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  KeyType local_48;
  TaskInterface local_28;
  
  local_28.ctx = ti.ctx;
  local_28.impl = ti.impl;
  paVar1 = &local_48.key.field_2;
  local_48.key._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"value-A","");
  llbuild::core::TaskInterface::request(&local_28,&local_48,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.key._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.key._M_dataplus._M_p,local_48.key.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
      // Request the known input.
      ti.request("value-A", 0);
    }